

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::e_formatter<spdlog::details::scoped_padder>::format
          (e_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  rep rVar1;
  undefined1 local_68 [8];
  scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  e_formatter<spdlog::details::scoped_padder> *this_local;
  
  millis.__r = (rep)dest;
  local_30 = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>
                       ((msg->time).__d.__r);
  p.spaces_.size_ = 3;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_68,3,&(this->super_flag_formatter).padinfo_,
             (memory_buf_t *)millis.__r);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
  fmt_helper::pad3<unsigned_int>((uint)rVar1,(memory_buf_t *)millis.__r);
  scoped_padder::~scoped_padder((scoped_padder *)local_68);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        const size_t field_size = 3;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
    }